

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

bool __thiscall
setup::anon_unknown_0::is_unsafe_path_char::operator()(is_unsafe_path_char *this,char c)

{
  char c_local;
  is_unsafe_path_char *this_local;
  undefined1 local_1;
  
  if ((byte)c < 0x20) {
    local_1 = true;
  }
  else if (c == '\"') {
    local_1 = true;
  }
  else if (c == '*') {
    local_1 = true;
  }
  else if (c == ':') {
    local_1 = true;
  }
  else if (c == '<') {
    local_1 = true;
  }
  else if (c == '>') {
    local_1 = true;
  }
  else if (c == '?') {
    local_1 = true;
  }
  else if (c == '|') {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool operator()(char c) {
		if(static_cast<unsigned char>(c) < 32) {
			return true;
		}
		switch(c) {
			case '<': return true;
			case '>': return true;
			case ':': return true;
			case '"': return true;
			case '|': return true;
			case '?': return true;
			case '*': return true;
			default:  return false;
		}
	}